

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_mulScalarVec_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar10;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar11;
  uint uVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  
  fVar1 = c->in[1].m_data[0];
  fVar2 = c->in[1].m_data[1];
  fVar3 = c->in[1].m_data[2];
  fVar4 = c->in[1].m_data[3];
  auVar8._0_4_ = (int)fVar1;
  auVar8._4_4_ = (int)fVar2;
  auVar8._8_4_ = (int)fVar3;
  auVar8._12_4_ = (int)fVar4;
  auVar14._0_4_ = auVar8._0_4_ >> 0x1f;
  auVar14._4_4_ = auVar8._4_4_ >> 0x1f;
  auVar14._8_4_ = auVar8._8_4_ >> 0x1f;
  auVar14._12_4_ = auVar8._12_4_ >> 0x1f;
  auVar7._0_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar7._4_4_ = (int)(fVar2 - 2.1474836e+09);
  auVar7._8_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar7._12_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar8 = auVar7 & auVar14 | auVar8;
  auVar12._4_4_ = auVar8._8_4_;
  auVar12._0_4_ = auVar8._12_4_;
  auVar12._8_4_ = auVar8._4_4_;
  auVar12._12_4_ = auVar8._0_4_;
  uVar5 = (ulong)c->in[0].m_data[2];
  auVar9._0_8_ = auVar8._8_8_;
  auVar9._8_4_ = auVar8._0_4_;
  auVar9._12_4_ = auVar8._4_4_;
  uVar6 = (uint)((ulong)auVar8._8_4_ * (uVar5 & 0xffffffff));
  uVar10 = (uint)((auVar9._8_8_ & 0xffffffff) * (uVar5 & 0xffffffff));
  uVar11 = (uint)((ulong)auVar8._12_4_ * (uVar5 & 0xffffffff));
  uVar13 = (uint)((auVar12._8_8_ & 0xffffffff) * (uVar5 & 0xffffffff));
  (c->color).m_data[0] =
       ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar11 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[1] =
       ((float)(uVar6 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar6 & 0xffff | 0x4b000000);
  (c->color).m_data[2] =
       ((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar13 & 0xffff | 0x4b000000)
  ;
  (c->color).m_data[3] =
       ((float)(uVar10 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar10 & 0xffff | 0x4b000000)
  ;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }